

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::onRet(RACFGBuilder *this,FuncRetNode *funcRet,RAInstBuilder *ib)

{
  byte bVar1;
  RegMask useRegMask;
  long lVar2;
  BaseBuilder *pBVar3;
  Environment vReg;
  uint uVar4;
  Error EVar5;
  RAWorkReg *in_RAX;
  BaseRAPass *this_00;
  ulong uVar6;
  int *piVar7;
  RAWorkReg *workReg;
  
  bVar1 = funcRet->field_0x12;
  if ((ulong)bVar1 != 0) {
    lVar2 = *(long *)(*(long *)this + 0x98);
    piVar7 = (int *)&funcRet->field_0x44;
    uVar6 = 0;
    workReg = in_RAX;
    do {
      if (piVar7[-1] != 0) {
        if (3 < uVar6) {
          onRet();
          return 0x1e;
        }
        uVar4 = *(uint *)(lVar2 + 0xc0 + uVar6 * 4);
        if ((uVar4 >> 8 & 1) == 0) {
          return 0x19;
        }
        if ((uVar4 & 0xff000000) != 0x16000000) {
          if ((piVar7[-1] & 7U) != 1) {
            return 0x19;
          }
          uVar4 = *piVar7 - 0x100;
          if (uVar4 < 0xfffffeff) {
            this_00 = *(BaseRAPass **)this;
            pBVar3 = (this_00->super_FuncPass).super_Pass._cb;
            if (*(uint *)&pBVar3[1].super_BaseEmitter._logger <= uVar4) {
              return 0x1e;
            }
            vReg = (&(pBVar3[1].super_BaseEmitter._code)->_environment)[uVar4];
            workReg = *(RAWorkReg **)((long)vReg + 0x28);
            if ((workReg == (RAWorkReg *)0x0) &&
               (EVar5 = BaseRAPass::_asWorkReg(this_00,(VirtReg *)vReg,&workReg), EVar5 != 0)) {
              return EVar5;
            }
            if (3 < ((byte)workReg[0x21] & 0xf)) {
              onRet();
              BaseRAPass::BaseRAPass(this_00);
              (this_00->super_FuncPass).super_Pass._vptr_Pass =
                   (_func_int **)&PTR__X86RAPass_00173c20;
              this_00[1].super_FuncPass.super_Pass._cb = (BaseBuilder *)0x0;
              this_00[1].super_FuncPass.super_Pass._vptr_Pass =
                   (_func_int **)&PTR__BaseEmitHelper_00173bd0;
              *(undefined2 *)&this_00[1].super_FuncPass.super_Pass._name = 0;
              this_00->_iEmitHelper = (BaseEmitHelper *)(this_00 + 1);
              return (Error)(this_00 + 1);
            }
            useRegMask = *(RegMask *)
                          (*(long *)this + 0x118 + (ulong)((byte)workReg[0x21] & 0xf) * 4);
            EVar5 = RAInstBuilder::add(ib,workReg,kUse|kRead,useRegMask,
                                       (uint)*(byte *)(lVar2 + 0xc2 + uVar6 * 4),0,useRegMask,0xff,0
                                       ,0,0xffffffff);
            if (EVar5 != 0) {
              return EVar5;
            }
          }
        }
      }
      uVar6 = uVar6 + 1;
      piVar7 = piVar7 + 4;
    } while (bVar1 != uVar6);
  }
  return 0;
}

Assistant:

Error RACFGBuilder::onRet(FuncRetNode* funcRet, RAInstBuilder& ib) noexcept {
  const FuncDetail& funcDetail = _pass->func()->detail();
  const Operand* opArray = funcRet->operands();
  uint32_t opCount = funcRet->opCount();

  for (uint32_t i = 0; i < opCount; i++) {
    const Operand& op = opArray[i];
    if (op.isNone()) continue;

    const FuncValue& ret = funcDetail.ret(i);
    if (ASMJIT_UNLIKELY(!ret.isReg()))
      return DebugUtils::errored(kErrorInvalidAssignment);

    // Not handled here...
    if (ret.regType() == RegType::kX86_St)
      continue;

    if (op.isReg()) {
      // Register return value.
      const Reg& reg = op.as<Reg>();
      uint32_t vIndex = Operand::virtIdToIndex(reg.id());

      if (vIndex < Operand::kVirtIdCount) {
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(vIndex, &workReg));

        RegGroup group = workReg->group();
        RegMask inOutRegs = _pass->_availableRegs[group];
        ASMJIT_PROPAGATE(ib.add(workReg, RATiedFlags::kUse | RATiedFlags::kRead, inOutRegs, ret.regId(), 0, inOutRegs, BaseReg::kIdBad, 0));
      }
    }
    else {
      return DebugUtils::errored(kErrorInvalidAssignment);
    }
  }

  return kErrorOk;
}